

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-batched.cpp
# Opt level: O1

int gpt2_decode(gpt2_model *model,ggml_gallocr_t allocr,gpt2_batch batch,int n_threads,
               vector<float,_std::allocator<float>_> *logits)

{
  int iVar1;
  pointer pgVar2;
  _Base_ptr p_Var3;
  void *pvVar4;
  gpt2_pos *pgVar5;
  int8_t *piVar6;
  id *piVar7;
  vector<float,_std::allocator<float>_> *pvVar8;
  size_type sVar9;
  char cVar10;
  uint uVar11;
  ggml_cgraph *pgVar12;
  undefined8 uVar13;
  long lVar14;
  _Rb_tree_header *p_Var15;
  long lVar16;
  char *__format;
  ulong uVar17;
  ulong uVar18;
  gpt2_seq_id *__v;
  _Base_ptr p_Var19;
  int iVar20;
  _Rb_tree_header *p_Var21;
  allocator_type local_91;
  ulong local_90;
  id *local_88;
  vector<float,_std::allocator<float>_> *local_80;
  long local_78;
  int local_6c;
  vector<float,_std::allocator<float>_> local_68;
  size_type local_50;
  ggml_cgraph *local_48;
  float *local_40;
  ggml_gallocr_t local_38;
  
  pgVar5 = batch.pos;
  uVar17 = (ulong)(uint)batch.n_tokens;
  local_80 = logits;
  if (uVar17 == 0) {
    iVar20 = -1;
    __format = "%s: n_tokens == 0";
  }
  else {
    local_88 = batch.token;
    local_6c = n_threads;
    if ((batch.embd != (float *)0x0) != (batch.token == (id *)0x0)) {
      uVar13 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/gpt-2/main-batched.cpp"
                          ,0x376,"GGML_ASSERT(%s) failed",
                          "(!batch.token && batch.embd) || (batch.token && !batch.embd)");
      pvVar4 = (void *)CONCAT44(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_);
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,(long)local_68.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar4);
      }
      _Unwind_Resume(uVar13);
    }
    local_40 = batch.embd;
    local_78 = (long)batch.n_tokens;
    local_50 = (size_type)(model->hparams).n_vocab;
    local_38 = allocr;
    if (0 < batch.n_tokens) {
      uVar18 = 0;
      __v = batch.seq_id;
      do {
        pgVar2 = (model->kv_cache).cells.
                 super__Vector_base<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>._M_impl.
                 super__Vector_impl_data._M_start + ((model->kv_cache).head + (int)uVar18);
        pgVar2->pos = pgVar5[uVar18];
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &pgVar2->seq_id,__v);
        uVar18 = uVar18 + 1;
        __v = __v + 1;
      } while (uVar17 != uVar18);
    }
    lVar16 = local_78;
    iVar20 = (int)local_78;
    (model->kv_cache).n = (model->kv_cache).head + iVar20;
    local_90 = uVar17;
    pgVar12 = gpt2_graph(model,&batch,false);
    ggml_gallocr_alloc_graph(local_38,pgVar12);
    piVar7 = local_88;
    local_48 = pgVar12;
    if (local_88 == (id *)0x0) {
      uVar13 = ggml_graph_get_tensor(pgVar12,"embd");
      iVar20 = (model->hparams).n_embd;
      lVar14 = ggml_element_size(uVar13);
      ggml_backend_tensor_set(uVar13,local_40,0,lVar16 * lVar14 * (long)iVar20);
    }
    else {
      uVar13 = ggml_graph_get_tensor(pgVar12,"inp_tokens");
      lVar14 = ggml_element_size(uVar13);
      ggml_backend_tensor_set(uVar13,piVar7,0,lVar14 * lVar16);
      uVar13 = ggml_graph_get_tensor(pgVar12,"position");
      pgVar5 = batch.pos;
      if (0 < iVar20) {
        lVar16 = local_90 * 4;
        lVar14 = 0;
        do {
          local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start._0_4_ = *(undefined4 *)((long)pgVar5 + lVar14);
          ggml_backend_tensor_set(uVar13,&local_68,lVar14,4);
          lVar14 = lVar14 + 4;
        } while (lVar16 - lVar14 != 0);
      }
    }
    local_88 = (id *)ggml_graph_get_tensor(local_48,"KQ_mask");
    uVar11 = (model->kv_cache).n;
    iVar20 = (int)local_90;
    std::vector<float,_std::allocator<float>_>::vector
              (&local_68,(long)(int)(uVar11 * iVar20),&local_91);
    if (0 < iVar20) {
      pgVar2 = (model->kv_cache).cells.
               super__Vector_base<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar16 = 0;
      do {
        if (0 < (int)uVar11) {
          iVar20 = batch.pos[lVar16];
          iVar1 = batch.seq_id[lVar16];
          uVar17 = 0;
          do {
            p_Var15 = (_Rb_tree_header *)((long)&pgVar2[uVar17].seq_id._M_t._M_impl + 8);
            p_Var19 = (_Base_ptr)p_Var15;
            for (p_Var3 = *(_Base_ptr *)((long)&pgVar2[uVar17].seq_id._M_t._M_impl + 0x10);
                (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
                p_Var3 = (&p_Var3->_M_left)[(int)*(size_t *)(p_Var3 + 1) < iVar1]) {
              if (iVar1 <= (int)*(size_t *)(p_Var3 + 1)) {
                p_Var19 = p_Var3;
              }
            }
            p_Var21 = p_Var15;
            if (((_Rb_tree_header *)p_Var19 != p_Var15) &&
               (p_Var21 = (_Rb_tree_header *)p_Var19,
               iVar1 < (int)((_Rb_tree_header *)p_Var19)->_M_node_count)) {
              p_Var21 = p_Var15;
            }
            if ((p_Var21 == p_Var15) || (iVar20 < pgVar2[uVar17].pos)) {
              *(undefined4 *)
               (lVar16 * (ulong)uVar11 * 4 +
                CONCAT44(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) + uVar17 * 4) = 0xff800000;
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 != uVar11);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != local_78);
    }
    ggml_backend_tensor_set
              (local_88,CONCAT44(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,
                                 local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start._0_4_),0,
               (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               CONCAT44(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_));
    pvVar4 = (void *)CONCAT44(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_);
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,(long)local_68.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar4)
      ;
    }
    cVar10 = ggml_backend_is_cpu(model->backend);
    if (cVar10 != '\0') {
      ggml_backend_cpu_set_n_threads(model->backend,local_6c);
    }
    pgVar12 = local_48;
    ggml_backend_graph_compute(model->backend,local_48);
    uVar13 = ggml_graph_node(pgVar12,0xffffffff);
    sVar9 = local_50;
    pvVar8 = local_80;
    piVar6 = batch.logits;
    if (batch.logits == (int8_t *)0x0) {
      std::vector<float,_std::allocator<float>_>::resize(local_80,local_50);
      ggml_backend_tensor_get
                (uVar13,(pvVar8->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_start,((long)(int)local_90 + -1) * sVar9 * 4,
                 sVar9 << 2);
    }
    else {
      std::vector<float,_std::allocator<float>_>::resize
                (local_80,(long)((int)local_50 * (int)local_78));
      if (0 < (int)local_90) {
        lVar16 = 0;
        uVar17 = 0;
        do {
          if (piVar6[uVar17] != '\0') {
            ggml_backend_tensor_get
                      (uVar13,(long)(local_80->super__Vector_base<float,_std::allocator<float>_>).
                                    _M_impl.super__Vector_impl_data._M_start + lVar16,lVar16,
                       sVar9 * 4);
          }
          uVar17 = uVar17 + 1;
          lVar16 = lVar16 + sVar9 * 4;
        } while (local_90 != uVar17);
      }
    }
    uVar11 = (model->kv_cache).head + (int)local_90;
    (model->kv_cache).head = uVar11;
    if (uVar11 < (model->kv_cache).size) {
      return 0;
    }
    iVar20 = -2;
    __format = "%s: cache.head >= cache.size\n";
  }
  printf(__format,"gpt2_decode");
  return iVar20;
}

Assistant:

int gpt2_decode(
        struct gpt2_model &  model,
        ggml_gallocr_t       allocr,
        struct gpt2_batch    batch,
        int                  n_threads,
        std::vector<float> & logits) {
    const int32_t n_tokens = batch.n_tokens;
    const auto &  hparams  = model.hparams;
    const int     n_vocab  = hparams.n_vocab;

    if (n_tokens == 0) {
        printf("%s: n_tokens == 0", __func__);
        return -1;
    }

    GGML_ASSERT((!batch.token && batch.embd) || (batch.token && !batch.embd));

    auto & cache = model.kv_cache;

    for (int i = 0; i < n_tokens; i++) {
        cache.cells[cache.head + i].pos = batch.pos[i];
        cache.cells[cache.head + i].seq_id.insert(batch.seq_id[i]);
    }

    cache.n = cache.head + n_tokens;

    struct ggml_cgraph * gf = gpt2_graph(model, batch, false);

    // allocate tensors
    ggml_gallocr_alloc_graph(allocr, gf);

    // set the graph inputs
    if (batch.token) {
        struct ggml_tensor * inp_tokens = ggml_graph_get_tensor(gf, "inp_tokens");
        ggml_backend_tensor_set(inp_tokens, batch.token, 0, n_tokens*ggml_element_size(inp_tokens));

        struct ggml_tensor * position = ggml_graph_get_tensor(gf, "position");
        for (int i = 0; i < n_tokens; ++i) {
            int32_t v = batch.pos[i];
            ggml_backend_tensor_set(position, &v, i*sizeof(int32_t), sizeof(v));
        }
    } else {
        struct ggml_tensor * embd = ggml_graph_get_tensor(gf, "embd");
        ggml_backend_tensor_set(embd, batch.embd, 0, n_tokens * hparams.n_embd * ggml_element_size(embd));
    }

    {
        struct ggml_tensor * KQ_mask = ggml_graph_get_tensor(gf, "KQ_mask");
        const auto & kv_cache = model.kv_cache;
        const int32_t n_tokens = batch.n_tokens;
        const int32_t n_kv     = kv_cache.n;

        std::vector<float> data_buf(n_kv*n_tokens);
        const float neg_inf_v = -INFINITY;

        for (int h = 0; h < 1; ++h) {
            int h_offset = h*(n_kv*n_tokens);
            for (int j = 0; j < n_tokens; ++j) {
                const gpt2_pos    pos    = batch.pos[j];
                const gpt2_seq_id seq_id = batch.seq_id[j];

                for (int i = 0; i < n_kv; ++i) {
                    if (!kv_cache.cells[i].has_seq_id(seq_id) || kv_cache.cells[i].pos > pos) {
                        data_buf[h_offset + j*n_kv + i] = neg_inf_v;
                    }
                }
            }
        }

        ggml_backend_tensor_set(KQ_mask, data_buf.data(), 0, data_buf.size() * sizeof(float));
    }

    // run the computation
    if (ggml_backend_is_cpu(model.backend)) {
        ggml_backend_cpu_set_n_threads(model.backend, n_threads);
    }
    ggml_backend_graph_compute(model.backend, gf);

    //if (n_past%100 == 0) {
    //    ggml_graph_print   (&gf);
    //    ggml_graph_dump_dot(&gf, NULL, "gpt-2.dot");
    //}

    // in this case, the output tensor is the last one in the graph
    struct ggml_tensor * inpL = ggml_graph_node(gf, -1);

    if (batch.logits) {
        // return logits for all tokens
        logits.resize(n_vocab*n_tokens);
        for (int32_t i = 0; i < n_tokens; i++) {
            if (batch.logits[i] == 0) {
                continue;
            }
            ggml_backend_tensor_get(inpL, logits.data() + n_vocab*i, n_vocab*i*sizeof(float), sizeof(float)*n_vocab);
        }
    } else {
        // return result just for the last token
        logits.resize(n_vocab);
        ggml_backend_tensor_get(inpL, logits.data(), (n_vocab*(n_tokens-1))*sizeof(float), sizeof(float)*n_vocab);
    }

    // update the kv ring buffer
    cache.head += n_tokens;

    // ensure kv cache head points to a valid index.
    if (cache.head >= cache.size) {
        printf("%s: cache.head >= cache.size\n", __func__);
        return -2;
    }

    return 0;
}